

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

bool CLI::detail::split_long(string *current,string *name,string *value)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if (2 < current->_M_string_length) {
    iVar2 = ::std::__cxx11::string::compare((ulong)current,0,(char *)0x2);
    if (iVar2 != 0) {
      return false;
    }
    bVar1 = (current->_M_dataplus)._M_p[2];
    if (0x21 < bVar1 && bVar1 != 0x2d) {
      lVar3 = ::std::__cxx11::string::find((char)current,0x3d);
      if (lVar3 == -1) {
        ::std::__cxx11::string::substr((ulong)local_48,(ulong)current);
        ::std::__cxx11::string::operator=((string *)name,(string *)local_48);
        if (local_48[0] != local_38) {
          operator_delete(local_48[0]);
        }
        ::std::__cxx11::string::_M_replace((ulong)value,0,(char *)value->_M_string_length,0x1479ca);
      }
      else {
        ::std::__cxx11::string::substr((ulong)local_48,(ulong)current);
        ::std::__cxx11::string::operator=((string *)name,(string *)local_48);
        if (local_48[0] != local_38) {
          operator_delete(local_48[0]);
        }
        ::std::__cxx11::string::substr((ulong)local_48,(ulong)current);
        ::std::__cxx11::string::operator=((string *)value,(string *)local_48);
        if (local_48[0] != local_38) {
          operator_delete(local_48[0]);
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

CLI11_INLINE bool split_long(const std::string &current, std::string &name, std::string &value) {
    if(current.size() > 2 && current.compare(0, 2, "--") == 0 && valid_first_char(current[2])) {
        auto loc = current.find_first_of('=');
        if(loc != std::string::npos) {
            name = current.substr(2, loc - 2);
            value = current.substr(loc + 1);
        } else {
            name = current.substr(2);
            value = "";
        }
        return true;
    }
    return false;
}